

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  byte *pbVar3;
  startElementSAXFunc p_Var4;
  xmlChar *pxVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *str2;
  xmlChar **ppxVar8;
  xmlParserInputPtr pxVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  xmlChar **ppxVar13;
  xmlChar *attvalue;
  xmlChar *local_48;
  byte *local_40;
  ulong local_38;
  
  pxVar9 = ctxt->input;
  pxVar7 = pxVar9->cur;
  if (*pxVar7 == '<') {
    ppxVar13 = ctxt->atts;
    iVar10 = ctxt->maxatts;
    pxVar9->col = pxVar9->col + 1;
    pxVar9->cur = pxVar7 + 1;
    if (pxVar7[1] == '\0') {
      xmlParserInputGrow(pxVar9,0xfa);
    }
    pxVar7 = xmlParseName(ctxt);
    if (pxVar7 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar12 = 0;
      do {
        pbVar3 = ctxt->input->cur;
        bVar1 = *pbVar3;
        if (bVar1 == 0x2f) {
          if (pbVar3[1] == 0x3e) goto LAB_0016573f;
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_0016573f;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_0016573f;
        local_38 = (ulong)(uint)ctxt->input->consumed;
        local_40 = pbVar3;
        str2 = xmlParseAttribute(ctxt,&local_48);
        pxVar5 = local_48;
        if (local_48 == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (local_48 != (xmlChar *)0x0) {
LAB_0016553a:
            (*xmlFree)(pxVar5);
          }
        }
        else {
          if (iVar12 < 1) {
            if (ppxVar13 != (xmlChar **)0x0) goto LAB_00165550;
            ppxVar8 = (xmlChar **)(*xmlMalloc)(0xb0);
            if (ppxVar8 == (xmlChar **)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              (*xmlFree)(pxVar5);
              iVar10 = 0x16;
              ppxVar13 = (xmlChar **)0x0;
              goto LAB_001655ed;
            }
            iVar10 = 0x16;
LAB_001655be:
            ctxt->atts = ppxVar8;
            ctxt->maxatts = iVar10;
            ppxVar13 = ppxVar8;
          }
          else {
            lVar11 = 0;
            do {
              iVar6 = xmlStrEqual(ppxVar13[lVar11],str2);
              if (iVar6 != 0) {
                xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
                (*xmlFree)(pxVar5);
                goto LAB_001655ed;
              }
              lVar11 = lVar11 + 2;
            } while ((int)lVar11 < iVar12);
LAB_00165550:
            if (iVar10 < iVar12 + 4) {
              iVar10 = iVar10 * 2;
              ppxVar8 = (xmlChar **)(*xmlRealloc)(ppxVar13,(long)iVar10 << 3);
              if (ppxVar8 == (xmlChar **)0x0) {
                xmlErrMemory(ctxt,(char *)0x0);
                goto LAB_0016553a;
              }
              goto LAB_001655be;
            }
          }
          ppxVar13[iVar12] = str2;
          ppxVar13[(long)iVar12 + 1] = local_48;
          ppxVar13[(long)iVar12 + 2] = (xmlChar *)0x0;
          (ppxVar13 + (long)iVar12 + 2)[1] = (xmlChar *)0x0;
          iVar12 = iVar12 + 2;
        }
LAB_001655ed:
        pxVar9 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar9 = ctxt->input;
        }
        xVar2 = *pxVar9->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar9->cur[1];
        }
        if (xVar2 == '>') goto LAB_0016573f;
        iVar6 = xmlSkipBlankChars(ctxt);
        if (iVar6 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
        }
        pxVar9 = ctxt->input;
        if ((((local_38 == pxVar9->consumed) && (str2 == (xmlChar *)0x0)) &&
            (local_40 == pxVar9->cur)) && (local_48 == (xmlChar *)0x0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                         "xmlParseStartTag: problem parsing attributes\n");
LAB_0016573f:
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
              (p_Var4 = ctxt->sax->startElement, p_Var4 != (startElementSAXFunc)0x0)) &&
             (ctxt->disableSAX == 0)) {
            if (iVar12 < 1) {
              (*p_Var4)(ctxt->userData,pxVar7,(xmlChar **)0x0);
              return pxVar7;
            }
            (*p_Var4)(ctxt->userData,pxVar7,ppxVar13);
          }
          if (iVar12 < 2 || ppxVar13 == (xmlChar **)0x0) {
            return pxVar7;
          }
          lVar11 = 1;
          do {
            if (ppxVar13[lVar11] != (xmlChar *)0x0) {
              (*xmlFree)(ppxVar13[lVar11]);
            }
            lVar11 = lVar11 + 2;
          } while ((int)lVar11 < iVar12);
          return pxVar7;
        }
        if ((ctxt->progressive == 0) &&
           (((((long)pxVar9->cur - (long)pxVar9->base < 0x1f5 ||
              (499 < (long)pxVar9->end - (long)pxVar9->cur)) ||
             (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
            ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
          xmlGROW(ctxt);
        }
      } while( true );
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
	const xmlChar *q = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == ctxt->input->consumed) && (q == CUR_PTR) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}